

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabwidget.cpp
# Opt level: O3

int __thiscall QTabWidget::heightForWidth(QTabWidget *this,int width)

{
  TabPosition TVar1;
  QTabWidgetPrivate *this_00;
  QWidget *pQVar2;
  bool bVar3;
  int iVar4;
  QStyle *pQVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  QTabWidget *that;
  int iVar14;
  int iVar15;
  long in_FS_OFFSET;
  QStyleOptionTabWidgetFrame opt;
  undefined8 local_c8;
  QStyleOptionTabWidgetFrame local_c0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTabWidgetPrivate **)&(this->super_QWidget).field_0x8;
  memset(&local_c0,0xaa,0x88);
  QStyleOptionTabWidgetFrame::QStyleOptionTabWidgetFrame(&local_c0);
  (**(code **)(*(long *)&this->super_QWidget + 0x1b0))(this,&local_c0);
  local_c0.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
  super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorageHelper<QStyle::StateFlag,_4>)(QFlagsStorage<QStyle::StateFlag>)0x0;
  local_c8 = 0;
  pQVar5 = QWidget::style(&this->super_QWidget);
  uVar6 = (**(code **)(*(long *)pQVar5 + 0xe8))(pQVar5,0x11,&local_c0,&local_c8,this);
  pQVar2 = this_00->leftCornerWidget;
  uVar8 = 0;
  uVar7 = 0;
  iVar11 = 0;
  if (pQVar2 != (QWidget *)0x0) {
    uVar7 = 0;
    iVar11 = 0;
    if ((pQVar2->data->widget_attributes & 0x8000) != 0) {
      uVar7 = (**(code **)(*(long *)pQVar2 + 0x70))();
      iVar11 = (int)((ulong)uVar7 >> 0x20);
    }
  }
  pQVar2 = this_00->rightCornerWidget;
  if (pQVar2 == (QWidget *)0x0) {
    iVar14 = 0;
  }
  else {
    iVar14 = 0;
    if ((pQVar2->data->widget_attributes & 0x8000) != 0) {
      uVar8 = (**(code **)(*(long *)pQVar2 + 0x70))();
      iVar14 = (int)((ulong)uVar8 >> 0x20);
    }
  }
  if (this_00->dirty == false) {
    setUpLayout(this,true);
  }
  bVar3 = QTabWidgetPrivate::isAutoHidden(this_00);
  iVar4 = -1;
  iVar15 = -1;
  if (!bVar3) {
    uVar9 = (**(code **)(*(long *)&this_00->tabs->super_QWidget + 0x70))();
    bVar3 = QTabBar::usesScrollButtons
                      (*(QTabBar **)(*(long *)&(this->super_QWidget).field_0x8 + 600));
    if (bVar3) {
      iVar15 = 200;
      iVar4 = 200;
      uVar10 = 200;
    }
    else {
      QGuiApplication::primaryScreen();
      uVar10 = QScreen::virtualSize();
      iVar15 = (int)((ulong)uVar10 >> 0x20);
      iVar4 = (int)uVar10;
    }
    if ((int)uVar9 < iVar4) {
      uVar10 = uVar9;
    }
    iVar4 = (int)uVar10;
    iVar13 = (int)((ulong)uVar9 >> 0x20);
    if (iVar13 < iVar15) {
      iVar15 = iVar13;
    }
  }
  TVar1 = this_00->pos;
  iVar13 = width - (int)uVar6;
  if (South < TVar1) {
    iVar12 = (int)uVar8;
    if ((int)uVar8 < (int)uVar7) {
      iVar12 = (int)uVar7;
    }
    if (iVar12 < iVar4) {
      iVar12 = iVar4;
    }
    iVar13 = iVar13 - iVar12;
  }
  iVar4 = (**(code **)(*(long *)&(this_00->stack->super_QFrame).super_QWidget + 0x80))
                    (this_00->stack,iVar13);
  if (TVar1 < West) {
    if (iVar15 < iVar11) {
      iVar15 = iVar11;
    }
    if (iVar15 <= iVar14) {
      iVar15 = iVar14;
    }
    iVar15 = iVar4 + iVar15;
  }
  else {
    iVar15 = iVar14 + iVar11 + iVar15;
    if (iVar15 <= iVar4) {
      iVar15 = iVar4;
    }
  }
  QStyleOption::~QStyleOption(&local_c0.super_QStyleOption);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar15 + (int)((ulong)uVar6 >> 0x20);
}

Assistant:

int QTabWidget::heightForWidth(int width) const
{
    Q_D(const QTabWidget);
    QStyleOptionTabWidgetFrame opt;
    initStyleOption(&opt);
    opt.state = QStyle::State_None;

    QSize zero(0,0);
    const QSize padding = style()->sizeFromContents(QStyle::CT_TabWidget, &opt, zero, this);

    QSize lc(0, 0), rc(0, 0);
    if (d->leftCornerWidget && d->leftCornerWidget->isVisible())
        lc = d->leftCornerWidget->sizeHint();
    if (d->rightCornerWidget && d->rightCornerWidget->isVisible())
        rc = d->rightCornerWidget->sizeHint();
    if (!d->dirty) {
        QTabWidget *that = const_cast<QTabWidget*>(this);
        that->setUpLayout(true);
    }
    QSize t;
    if (!d->isAutoHidden()) {
        t = d->tabs->sizeHint();
        if (usesScrollButtons())
            t = t.boundedTo(QSize(200,200));
        else
            t = t.boundedTo(QGuiApplication::primaryScreen()->virtualSize());
    }

    const bool tabIsHorizontal = (d->pos == North || d->pos == South);
    const int contentsWidth = width - padding.width();
    int stackWidth = contentsWidth;
    if (!tabIsHorizontal)
        stackWidth -= qMax(t.width(), qMax(lc.width(), rc.width()));

    int stackHeight = d->stack->heightForWidth(stackWidth);
    QSize s(stackWidth, stackHeight);

    QSize contentSize = basicSize(tabIsHorizontal, lc, rc, s, t);
    return (contentSize + padding).height();
}